

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O1

void __thiscall
SightCheck::P_SightOpening
          (SightCheck *this,SightOpening *open,line_t_conflict *linedef,double x,double y)

{
  sector_t_conflict *psVar1;
  sector_t_conflict *psVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  open->portalflags = 0;
  psVar1 = linedef->frontsector;
  psVar2 = linedef->backsector;
  if (psVar2 == (sector_t_conflict *)0x0) {
    uVar3 = 0;
    if ((int)linedef->flags < 0) {
      if ((psVar1->planes[1].Flags & 0x1d8U) == 0x100) {
        open->portalflags = 1;
      }
      if ((psVar1->planes[0].Flags & 0x1d8U) == 0x100) {
        *(byte *)&open->portalflags = (byte)open->portalflags | 4;
      }
    }
  }
  else {
    dVar4 = 0.0;
    dVar6 = 0.0;
    dVar5 = 0.0;
    dVar7 = 0.0;
    if ((int)linedef->flags < 0) {
      if ((psVar1->planes[1].Flags & 0x1d8U) == 0x100) {
        open->portalflags = 1;
        dVar4 = 3.4028234663852886e+38;
      }
      if ((psVar2->planes[1].Flags & 0x1d8U) == 0x100) {
        *(byte *)&open->portalflags = (byte)open->portalflags | 2;
        dVar5 = 3.4028234663852886e+38;
      }
      if ((psVar1->planes[0].Flags & 0x1d8U) == 0x100) {
        *(byte *)&open->portalflags = (byte)open->portalflags | 4;
        dVar6 = -3.4028234663852886e+38;
      }
      if ((psVar2->planes[0].Flags & 0x1d8U) == 0x100) {
        *(byte *)&open->portalflags = (byte)open->portalflags | 8;
        dVar7 = -3.4028234663852886e+38;
      }
    }
    if ((dVar4 == 0.0) && (!NAN(dVar4))) {
      dVar4 = ((psVar1->ceilingplane).normal.Y * y +
              (psVar1->ceilingplane).normal.X * x + (psVar1->ceilingplane).D) *
              (psVar1->ceilingplane).negiC;
    }
    if ((dVar5 == 0.0) && (!NAN(dVar5))) {
      dVar5 = ((psVar2->ceilingplane).normal.Y * y +
              (psVar2->ceilingplane).normal.X * x + (psVar2->ceilingplane).D) *
              (psVar2->ceilingplane).negiC;
    }
    if ((dVar6 == 0.0) && (!NAN(dVar6))) {
      dVar6 = ((psVar1->floorplane).normal.Y * y +
              (psVar1->floorplane).normal.X * x + (psVar1->floorplane).D) *
              (psVar1->floorplane).negiC;
    }
    if ((dVar7 == 0.0) && (!NAN(dVar7))) {
      dVar7 = (y * (psVar2->floorplane).normal.Y +
              x * (psVar2->floorplane).normal.X + (psVar2->floorplane).D) *
              (psVar2->floorplane).negiC;
    }
    if (dVar6 <= dVar7) {
      dVar6 = dVar7;
    }
    open->bottom = dVar6;
    if (dVar5 <= dVar4) {
      dVar4 = dVar5;
    }
    open->top = dVar4;
    uVar3 = (uint)(dVar6 < dVar4);
  }
  open->range = uVar3;
  return;
}

Assistant:

void SightCheck::P_SightOpening(SightOpening &open, const line_t *linedef, double x, double y)
{
	open.portalflags = 0;
	sector_t *front = linedef->frontsector;
	sector_t *back = linedef->backsector;

	if (back == NULL)
	{
		// single sided line
		if (linedef->flags & ML_PORTALCONNECT)
		{
			if (!front->PortalBlocksSight(sector_t::ceiling)) open.portalflags |= SO_TOPFRONT;
			if (!front->PortalBlocksSight(sector_t::floor)) open.portalflags |= SO_BOTTOMFRONT;
		}

		open.range = 0;
		return;
	}


	double fc = 0, ff = 0, bc = 0, bf = 0;

	if (linedef->flags & ML_PORTALCONNECT)
	{
		if (!front->PortalBlocksSight(sector_t::ceiling)) fc = LINEOPEN_MAX, open.portalflags |= SO_TOPFRONT;
		if (!back->PortalBlocksSight(sector_t::ceiling)) bc = LINEOPEN_MAX, open.portalflags |= SO_TOPBACK;
		if (!front->PortalBlocksSight(sector_t::floor)) ff = LINEOPEN_MIN, open.portalflags |= SO_BOTTOMFRONT;
		if (!back->PortalBlocksSight(sector_t::floor)) bf = LINEOPEN_MIN, open.portalflags |= SO_BOTTOMBACK;
	}

	if (fc == 0) fc = front->ceilingplane.ZatPoint(x, y);
	if (bc == 0) bc = back->ceilingplane.ZatPoint(x, y);
	if (ff == 0) ff = front->floorplane.ZatPoint(x, y);
	if (bf == 0) bf = back->floorplane.ZatPoint(x, y);

	open.bottom = MAX(ff, bf);
	open.top = MIN(fc, bc);

	// we only want to know if there is an opening, not how large it is.
	open.range = open.bottom < open.top;
}